

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.h
# Opt level: O3

void __thiscall
Assimp::MDL::HalfLife::HL1MDLLoader::
load_file_into_buffer<Assimp::MDL::HalfLife::SequenceHeader_HL1>
          (HL1MDLLoader *this,string *file_path,uchar **buffer)

{
  IOSystem *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  uchar *puVar4;
  long *plVar5;
  runtime_error *prVar6;
  long *plVar7;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar2 = (*this->io_->_vptr_IOSystem[2])(this->io_,(file_path->_M_dataplus)._M_p);
  if ((char)iVar2 == '\0') {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    DefaultIOSystem::fileName(&local_68,file_path);
    std::operator+(&local_48,"Missing file ",&local_68);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
    local_88 = (long *)*plVar5;
    plVar7 = plVar5 + 2;
    if (local_88 == plVar7) {
      local_78 = *plVar7;
      lStack_70 = plVar5[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar7;
    }
    local_80 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)&local_88);
    *(undefined ***)prVar6 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pIVar1 = this->io_;
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"rb","");
  iVar2 = (*pIVar1->_vptr_IOSystem[4])(pIVar1,(file_path->_M_dataplus)._M_p,local_88);
  plVar5 = (long *)CONCAT44(extraout_var,iVar2);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (plVar5 != (long *)0x0) {
    uVar3 = (**(code **)(*plVar5 + 0x30))(plVar5);
    if (0x4b < uVar3) {
      puVar4 = (uchar *)operator_new__(uVar3 + 1);
      *buffer = puVar4;
      (**(code **)(*plVar5 + 0x10))(plVar5,puVar4,1,uVar3);
      (*buffer)[uVar3] = '\0';
      (**(code **)(*plVar5 + 8))(plVar5);
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"MDL file is too small.","")
    ;
    std::runtime_error::runtime_error(prVar6,(string *)&local_88);
    *(undefined ***)prVar6 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  DefaultIOSystem::fileName(&local_68,file_path);
  std::operator+(&local_48,"Failed to open MDL file ",&local_68);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_88 = (long *)*plVar5;
  plVar7 = plVar5 + 2;
  if (local_88 == plVar7) {
    local_78 = *plVar7;
    lStack_70 = plVar5[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar7;
  }
  local_80 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::runtime_error::runtime_error(prVar6,(string *)&local_88);
  *(undefined ***)prVar6 = &PTR__runtime_error_0080bf48;
  __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void HL1MDLLoader::load_file_into_buffer(const std::string &file_path, unsigned char *&buffer) {
    if (!io_->Exists(file_path))
        throw DeadlyImportError("Missing file " + DefaultIOSystem::fileName(file_path) + ".");

    std::unique_ptr<IOStream> file(io_->Open(file_path));

    if (file.get() == NULL)
        throw DeadlyImportError("Failed to open MDL file " + DefaultIOSystem::fileName(file_path) + ".");

    const size_t file_size = file->FileSize();
    if (file_size < sizeof(MDLFileHeader))
        throw DeadlyImportError("MDL file is too small.");

    buffer = new unsigned char[1 + file_size];
    file->Read((void *)buffer, 1, file_size);
    buffer[file_size] = '\0';
}